

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

qreal __thiscall QGraphicsItemAnimation::rotationAt(QGraphicsItemAnimation *this,qreal step)

{
  char *this_00;
  qreal qVar1;
  
  this_00 = "rotationAt";
  check_step_valid(step,"rotationAt");
  qVar1 = QGraphicsItemAnimationPrivate::linearValueForStep
                    ((QGraphicsItemAnimationPrivate *)this_00,step,
                     (QList<QGraphicsItemAnimationPrivate::Pair> *)(*(long *)(this + 0x10) + 0xb8),
                     0.0);
  return qVar1;
}

Assistant:

qreal QGraphicsItemAnimation::rotationAt(qreal step) const
{
    check_step_valid(step, "rotationAt");
    return d->linearValueForStep(step, d->rotation);
}